

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O2

REF_STATUS
ref_iso_segment_segment
          (REF_DBL *candidate0,REF_DBL *candidate1,REF_DBL *segment0,REF_DBL *segment1,REF_DBL *tt)

{
  REF_STATUS RVar1;
  REF_DBL RVar2;
  REF_DBL RVar3;
  REF_DBL RVar4;
  REF_DBL RVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  *tt = 0.0;
  tt[1] = 0.0;
  RVar2 = ref_iso_area(candidate0,segment1,segment0);
  RVar3 = ref_iso_area(segment0,candidate1,candidate0);
  RVar4 = ref_iso_area(segment1,candidate0,candidate1);
  auVar7._0_8_ = (RVar4 + RVar3) * 1e+20;
  auVar7._8_8_ = RVar3;
  auVar8._0_8_ = -auVar7._0_8_;
  auVar8._8_8_ = -RVar3;
  auVar8 = maxpd(auVar7,auVar8);
  RVar1 = 4;
  if (auVar8._8_8_ < auVar8._0_8_) {
    RVar5 = ref_iso_area(candidate1,segment0,segment1);
    *tt = RVar3 / (RVar4 + RVar3);
    auVar6._0_8_ = (RVar5 + RVar2) * 1e+20;
    auVar6._8_8_ = RVar2;
    auVar9._0_8_ = -auVar6._0_8_;
    auVar9._8_8_ = -RVar2;
    auVar8 = maxpd(auVar6,auVar9);
    if (auVar8._8_8_ < auVar8._0_8_) {
      tt[1] = RVar2 / (RVar5 + RVar2);
      RVar1 = 0;
    }
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_iso_segment_segment(REF_DBL *candidate0,
                                           REF_DBL *candidate1,
                                           REF_DBL *segment0, REF_DBL *segment1,
                                           REF_DBL *tt) {
  double cand0_area, cand1_area;
  double seg0_area, seg1_area;
  double total_area;

  tt[0] = 0.0;
  tt[1] = 0.0;

  /*         c1 tt[1]
   *        /
   *  s0---+----s1 tt[0]
   *      /
   *    c0
   */

  cand0_area = ref_iso_area(candidate0, segment1, segment0);
  cand1_area = ref_iso_area(candidate1, segment0, segment1);
  seg0_area = ref_iso_area(segment0, candidate1, candidate0);
  seg1_area = ref_iso_area(segment1, candidate0, candidate1);

  total_area = seg0_area + seg1_area;
  if (ref_math_divisible(seg0_area, total_area)) {
    tt[0] = seg0_area / total_area;
  } else {
    return REF_DIV_ZERO;
  }

  total_area = cand0_area + cand1_area;
  if (ref_math_divisible(cand0_area, total_area)) {
    tt[1] = cand0_area / total_area;
  } else {
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}